

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

die_range_info_iterator __thiscall
llvm::DWARFVerifier::DieRangeInfo::insert(DieRangeInfo *this,DieRangeInfo *RI)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var2 = (this->Children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->Children)._M_t._M_impl.super__Rb_tree_header;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == p_Var3) {
      std::
      _Rb_tree<llvm::DWARFVerifier::DieRangeInfo,llvm::DWARFVerifier::DieRangeInfo,std::_Identity<llvm::DWARFVerifier::DieRangeInfo>,std::less<llvm::DWARFVerifier::DieRangeInfo>,std::allocator<llvm::DWARFVerifier::DieRangeInfo>>
      ::_M_insert_unique<llvm::DWARFVerifier::DieRangeInfo_const&>
                ((_Rb_tree<llvm::DWARFVerifier::DieRangeInfo,llvm::DWARFVerifier::DieRangeInfo,std::_Identity<llvm::DWARFVerifier::DieRangeInfo>,std::less<llvm::DWARFVerifier::DieRangeInfo>,std::allocator<llvm::DWARFVerifier::DieRangeInfo>>
                  *)&this->Children,RI);
      return (die_range_info_iterator)&p_Var3->_M_header;
    }
    bVar1 = intersects((DieRangeInfo *)(p_Var2 + 1),RI);
    if (bVar1) break;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  return (die_range_info_iterator)p_Var2;
}

Assistant:

DWARFVerifier::DieRangeInfo::die_range_info_iterator
DWARFVerifier::DieRangeInfo::insert(const DieRangeInfo &RI) {
  auto End = Children.end();
  auto Iter = Children.begin();
  while (Iter != End) {
    if (Iter->intersects(RI))
      return Iter;
    ++Iter;
  }
  Children.insert(RI);
  return Children.end();
}